

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  xml_attribute in_RSI;
  namespace_uri_predicate *in_RDI;
  xml_attribute attrib;
  namespace_uri_predicate *this_00;
  xml_attribute local_8;
  
  if ((xml_node_struct *)in_RDI->prefix == (xml_node_struct *)0x0) {
    xml_attribute::xml_attribute(&local_8);
  }
  else {
    this_00 = in_RDI;
    local_8 = first_attribute((xml_node *)in_RDI);
    while (p_Var2 = xml_attribute::operator_cast_to_function_pointer(&local_8),
          p_Var2 != (unspecified_bool_type)0x0) {
      bVar1 = impl::anon_unknown_0::namespace_uri_predicate::operator()(this_00,in_RSI);
      if (bVar1) {
        return (xml_attribute)local_8._attr;
      }
      local_8 = xml_attribute::next_attribute((xml_attribute *)in_RDI);
    }
    xml_attribute::xml_attribute(&local_8);
  }
  return (xml_attribute)local_8._attr;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}